

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

uint32_t immutable::rrb_details::find_shift<int,false,6>
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *node)

{
  tree_node<int,_false> *ptVar1;
  uint32_t uVar2;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_10;
  
  ptVar1 = node->ptr;
  if (ptVar1 != (tree_node<int,_false> *)0x0) {
    if (ptVar1->type == LEAF_NODE) {
      uVar2 = 0;
    }
    else {
      local_10.ptr = (tree_node<int,_false> *)**(long **)&ptVar1[1]._ref_count;
      if (local_10.ptr != (tree_node<int,_false> *)0x0) {
        (local_10.ptr)->_ref_count = (local_10.ptr)->_ref_count + 1;
      }
      uVar2 = find_shift<int,false,6>(&local_10);
      uVar2 = uVar2 + 6;
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_10);
    }
    return uVar2;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb_details::tree_node<int, false>>::operator->() const [T = immutable::rrb_details::tree_node<int, false>]"
               );
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }